

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Scan.H
# Opt level: O0

int amrex::Scan::
    PrefixSum<int,int,amrex::FillSignedDistance(amrex::MultiFab&,amrex::EB2::Level_const&,amrex::EBFArrayBoxFactory_const&,int,bool)::__0,amrex::FillSignedDistance(amrex::MultiFab&,amrex::EB2::Level_const&,amrex::EBFArrayBoxFactory_const&,int,bool)::__1,amrex::Scan::Type::Exclusive,void>
              (int param_1,anon_class_104_3_38dc44be *param_2,anon_class_8_1_beaf9cbb *param_3,
              undefined1 param_4)

{
  int y;
  int x;
  int i;
  int totalsum;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  anon_class_8_1_beaf9cbb *local_20;
  anon_class_104_3_38dc44be *local_18;
  int local_c;
  undefined1 local_6;
  int local_4;
  
  if (param_1 < 1) {
    local_4 = 0;
  }
  else {
    local_24 = 0;
    local_20 = param_3;
    local_18 = param_2;
    local_c = param_1;
    local_6 = param_4;
    for (local_28 = 0; local_28 < local_c; local_28 = local_28 + 1) {
      local_2c = FillSignedDistance::anon_class_104_3_38dc44be::operator()(local_18,local_28);
      local_30 = local_24;
      local_24 = local_2c + local_24;
      FillSignedDistance::anon_class_8_1_beaf9cbb::operator()(local_20,local_28,&local_30);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

T PrefixSum (N n, FIN && fin, FOUT && fout, TYPE, RetSum = retSum)
{
    if (n <= 0) return 0;
    T totalsum = 0;
    for (N i = 0; i < n; ++i) {
        T x = fin(i);
        T y = totalsum;
        totalsum += x;
        AMREX_IF_CONSTEXPR (std::is_same<std::decay_t<TYPE>,Type::Inclusive>::value) {
            y += x;
        }
        fout(i, y);
    }
    return totalsum;
}